

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlChar * xmlXPathCastToString(xmlXPathObjectPtr val)

{
  xmlGenericErrorFunc p_Var1;
  xmlChar *pxVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  char *cur;
  
  if (val != (xmlXPathObjectPtr)0x0) {
    switch(val->type) {
    case XPATH_UNDEFINED:
      break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      pxVar2 = xmlXPathCastNodeSetToString(val->nodesetval);
      return pxVar2;
    case XPATH_BOOLEAN:
      cur = "true";
      if (val->boolval == 0) {
        cur = "false";
      }
      pxVar2 = xmlStrdup((xmlChar *)cur);
      return pxVar2;
    case XPATH_NUMBER:
      pxVar2 = xmlXPathCastNumberToString(val->floatval);
      return pxVar2;
    case XPATH_STRING:
      pxVar2 = xmlStrdup(val->stringval);
      return pxVar2;
    default:
      return (xmlChar *)0x0;
    case XPATH_USERS:
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xpath.c",
                0x169d);
      pxVar2 = xmlStrdup("");
      return pxVar2;
    }
  }
  pxVar2 = xmlStrdup("");
  return pxVar2;
}

Assistant:

xmlChar *
xmlXPathCastToString(xmlXPathObjectPtr val) {
    xmlChar *ret = NULL;

    if (val == NULL)
	return(xmlStrdup((const xmlChar *) ""));
    switch (val->type) {
	case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
	    xmlGenericError(xmlGenericErrorContext, "String: undefined\n");
#endif
	    ret = xmlStrdup((const xmlChar *) "");
	    break;
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
	    ret = xmlXPathCastNodeSetToString(val->nodesetval);
	    break;
	case XPATH_STRING:
	    return(xmlStrdup(val->stringval));
        case XPATH_BOOLEAN:
	    ret = xmlXPathCastBooleanToString(val->boolval);
	    break;
	case XPATH_NUMBER: {
	    ret = xmlXPathCastNumberToString(val->floatval);
	    break;
	}
	case XPATH_USERS:
#ifdef LIBXML_XPTR_LOCS_ENABLED
	case XPATH_POINT:
	case XPATH_RANGE:
	case XPATH_LOCATIONSET:
#endif /* LIBXML_XPTR_LOCS_ENABLED */
	    TODO
	    ret = xmlStrdup((const xmlChar *) "");
	    break;
    }
    return(ret);
}